

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O0

unsigned_long
AdaptingInputOnlyProcess
          (PaUtilBufferProcessor *bp,int *streamCallbackResult,
          PaUtilChannelDescriptor *hostInputChannels,unsigned_long framesToProcess)

{
  unsigned_long uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  unsigned_long local_70;
  unsigned_long local_68;
  unsigned_long framesProcessed;
  unsigned_long framesToGo;
  unsigned_long frameCount;
  uint local_48;
  uint i;
  uint destChannelStrideBytes;
  uint destSampleStrideSamples;
  uchar *destBytePtr;
  void *userOutput;
  void *userInput;
  unsigned_long framesToProcess_local;
  PaUtilChannelDescriptor *hostInputChannels_local;
  int *streamCallbackResult_local;
  PaUtilBufferProcessor *bp_local;
  
  local_68 = 0;
  framesProcessed = framesToProcess;
  do {
    if (bp->framesPerUserBuffer < bp->framesInTempInputBuffer + framesProcessed) {
      local_70 = bp->framesPerUserBuffer - bp->framesInTempInputBuffer;
    }
    else {
      local_70 = framesProcessed;
    }
    if (bp->userInputIsInterleaved == 0) {
      _destChannelStrideBytes =
           (void *)((long)bp->tempInputBuffer +
                   (ulong)bp->bytesPerUserInputSample * bp->framesInTempInputBuffer);
      i = 1;
      local_48 = (int)bp->framesPerUserBuffer * bp->bytesPerUserInputSample;
      for (frameCount._4_4_ = 0; frameCount._4_4_ < bp->inputChannelCount;
          frameCount._4_4_ = frameCount._4_4_ + 1) {
        bp->tempInputBufferPtrs[frameCount._4_4_] =
             (void *)((long)bp->tempInputBuffer +
                     (ulong)(frameCount._4_4_ * bp->bytesPerUserInputSample) *
                     bp->framesPerUserBuffer);
      }
      userOutput = bp->tempInputBufferPtrs;
    }
    else {
      _destChannelStrideBytes =
           (void *)((long)bp->tempInputBuffer +
                   (ulong)(bp->bytesPerUserInputSample * bp->inputChannelCount) *
                   bp->framesInTempInputBuffer);
      i = bp->inputChannelCount;
      local_48 = bp->bytesPerUserInputSample;
      userOutput = bp->tempInputBuffer;
    }
    for (frameCount._4_4_ = 0; frameCount._4_4_ < bp->inputChannelCount;
        frameCount._4_4_ = frameCount._4_4_ + 1) {
      (*bp->inputConverter)
                (_destChannelStrideBytes,i,hostInputChannels[frameCount._4_4_].data,
                 hostInputChannels[frameCount._4_4_].stride,(uint)local_70,&bp->ditherGenerator);
      _destChannelStrideBytes = (void *)((long)_destChannelStrideBytes + (ulong)local_48);
      hostInputChannels[frameCount._4_4_].data =
           (void *)((long)hostInputChannels[frameCount._4_4_].data +
                   local_70 * hostInputChannels[frameCount._4_4_].stride *
                   (ulong)bp->bytesPerHostInputSample);
    }
    bp->framesInTempInputBuffer = local_70 + bp->framesInTempInputBuffer;
    if (bp->framesInTempInputBuffer == bp->framesPerUserBuffer) {
      if (*streamCallbackResult == 0) {
        bp->timeInfo->outputBufferDacTime = 0.0;
        iVar2 = (*bp->streamCallback)
                          (userOutput,(void *)0x0,bp->framesPerUserBuffer,bp->timeInfo,
                           bp->callbackStatusFlags,bp->userData);
        *streamCallbackResult = iVar2;
        uVar1 = bp->framesPerUserBuffer;
        auVar3._8_4_ = (int)(uVar1 >> 0x20);
        auVar3._0_8_ = uVar1;
        auVar3._12_4_ = 0x45300000;
        bp->timeInfo->inputBufferAdcTime =
             ((auVar3._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * bp->samplePeriod +
             bp->timeInfo->inputBufferAdcTime;
      }
      bp->framesInTempInputBuffer = 0;
    }
    local_68 = local_70 + local_68;
    framesProcessed = framesProcessed - local_70;
  } while (framesProcessed != 0);
  return local_68;
}

Assistant:

static unsigned long AdaptingInputOnlyProcess( PaUtilBufferProcessor *bp,
        int *streamCallbackResult,
        PaUtilChannelDescriptor *hostInputChannels,
        unsigned long framesToProcess )
{
    void *userInput, *userOutput;
    unsigned char *destBytePtr;
    unsigned int destSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int destChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i;
    unsigned long frameCount;
    unsigned long framesToGo = framesToProcess;
    unsigned long framesProcessed = 0;
    
    userOutput = 0;

    do
    {
        frameCount = ( bp->framesInTempInputBuffer + framesToGo > bp->framesPerUserBuffer )
                ? ( bp->framesPerUserBuffer - bp->framesInTempInputBuffer )
                : framesToGo;

        /* convert frameCount samples into temp buffer */

        if( bp->userInputIsInterleaved )
        {
            destBytePtr = ((unsigned char*)bp->tempInputBuffer) +
                    bp->bytesPerUserInputSample * bp->inputChannelCount *
                    bp->framesInTempInputBuffer;
                      
            destSampleStrideSamples = bp->inputChannelCount;
            destChannelStrideBytes = bp->bytesPerUserInputSample;

            userInput = bp->tempInputBuffer;
        }
        else /* user input is not interleaved */
        {
            destBytePtr = ((unsigned char*)bp->tempInputBuffer) +
                    bp->bytesPerUserInputSample * bp->framesInTempInputBuffer;

            destSampleStrideSamples = 1;
            destChannelStrideBytes = bp->framesPerUserBuffer * bp->bytesPerUserInputSample;

            /* setup non-interleaved ptrs */
            for( i=0; i<bp->inputChannelCount; ++i )
            {
                bp->tempInputBufferPtrs[i] = ((unsigned char*)bp->tempInputBuffer) +
                    i * bp->bytesPerUserInputSample * bp->framesPerUserBuffer;
            }
                    
            userInput = bp->tempInputBufferPtrs;
        }

        for( i=0; i<bp->inputChannelCount; ++i )
        {
            bp->inputConverter( destBytePtr, destSampleStrideSamples,
                                    hostInputChannels[i].data,
                                    hostInputChannels[i].stride,
                                    frameCount, &bp->ditherGenerator );

            destBytePtr += destChannelStrideBytes;  /* skip to next destination channel */

            /* advance src ptr for next iteration */
            hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                    frameCount * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
        }

        bp->framesInTempInputBuffer += frameCount;

        if( bp->framesInTempInputBuffer == bp->framesPerUserBuffer )
        {
            /**
            @todo (non-critical optimisation)
            The conditional below implements the continue/complete/abort mechanism
            simply by continuing on iterating through the input buffer, but not
            passing the data to the callback. With care, the outer loop could be
            terminated earlier, thus some unneeded conversion cycles would be
            saved.
            */
            if( *streamCallbackResult == paContinue )
            {
                bp->timeInfo->outputBufferDacTime = 0;

                *streamCallbackResult = bp->streamCallback( userInput, userOutput,
                        bp->framesPerUserBuffer, bp->timeInfo,
                        bp->callbackStatusFlags, bp->userData );

                bp->timeInfo->inputBufferAdcTime += bp->framesPerUserBuffer * bp->samplePeriod;
            }
            
            bp->framesInTempInputBuffer = 0;
        }

        framesProcessed += frameCount;

        framesToGo -= frameCount;
    }while( framesToGo > 0 );

    return framesProcessed;
}